

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte bVar1;
  ushort uVar2;
  ushort x;
  int iVar3;
  uint16_t *puVar4;
  _Bool _Var5;
  int32_t iVar6;
  int iVar7;
  ulong uVar8;
  array_container_t *paVar9;
  undefined4 extraout_var;
  array_container_t *paVar10;
  uint uVar11;
  int iVar12;
  array_container_t *paVar13;
  uint8_t uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  byte type2;
  ulong uVar18;
  array_container_t *paVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  bool bVar23;
  uint8_t result_type;
  uint8_t local_69;
  array_container_t *local_68;
  ushort local_5e;
  int local_5c;
  ulong local_58;
  array_container_t *local_50;
  roaring_bitmap_t *local_48;
  ulong local_40;
  ulong local_38;
  
  if (x1 != x2) {
    iVar3 = (x1->high_low_container).size;
    iVar7 = (x2->high_low_container).size;
    uVar20 = 0;
    uVar8 = 0;
    if (0 < iVar7 && 0 < iVar3) {
      uVar8 = 0;
      uVar17 = 0;
      uVar20 = 0;
      local_5c = iVar7;
      local_48 = x2;
      do {
        uVar11 = (uint)uVar8 & 0xffff;
        uVar2 = (x1->high_low_container).keys[uVar11];
        puVar4 = (x2->high_low_container).keys;
        uVar15 = uVar17 & 0xffff;
        x = puVar4[uVar15];
        if (uVar2 != x) {
          if (uVar2 < x) {
            iVar6 = ra_advance_until_freeing(&x1->high_low_container,x,(uint)uVar8);
            uVar8 = CONCAT44(extraout_var,iVar6);
            uVar16 = uVar17;
          }
          else {
            uVar15 = (x2->high_low_container).size;
            uVar11 = uVar17 + 1;
            uVar16 = uVar11;
            if (((int)uVar11 < (int)uVar15) && (puVar4[(int)uVar11] < uVar2)) {
              uVar17 = uVar17 + 2;
              iVar22 = 1;
              if ((int)uVar17 < (int)uVar15) {
                iVar12 = 1;
                do {
                  iVar22 = iVar12;
                  if (uVar2 <= puVar4[(int)uVar17]) goto LAB_0011686f;
                  iVar22 = iVar12 * 2;
                  uVar17 = uVar11 + iVar12 * 2;
                  iVar12 = iVar22;
                } while ((int)uVar17 < (int)uVar15);
              }
              uVar17 = uVar15 - 1;
LAB_0011686f:
              uVar16 = uVar17;
              if (((puVar4[(int)uVar17] != uVar2) && (uVar16 = uVar15, uVar2 <= puVar4[(int)uVar17])
                  ) && (uVar16 = uVar17, (iVar22 >> 1) + uVar11 + 1 != uVar17)) {
                uVar11 = (iVar22 >> 1) + uVar11;
                do {
                  uVar16 = (int)(uVar11 + uVar17) >> 1;
                  if (puVar4[(int)uVar16] == uVar2) break;
                  if (uVar2 <= puVar4[(int)uVar16]) {
                    uVar17 = uVar16;
                    uVar16 = uVar11;
                  }
                  uVar11 = uVar16;
                  uVar16 = uVar17;
                } while (uVar11 + 1 != uVar17);
              }
            }
          }
          goto LAB_00116a4c;
        }
        bVar1 = (x1->high_low_container).typecodes[uVar11];
        local_40 = (ulong)bVar1;
        paVar13 = (array_container_t *)(x1->high_low_container).containers[uVar11];
        type2 = (x2->high_low_container).typecodes[uVar15];
        paVar19 = (array_container_t *)(x2->high_low_container).containers[uVar15];
        local_5e = uVar2;
        local_58 = uVar8;
        local_38 = uVar20;
        if (bVar1 == 4) {
          paVar9 = (array_container_t *)container_and(paVar13,'\x04',paVar19,type2,&local_69);
          goto LAB_0011674c;
        }
        local_50 = paVar13;
        if (type2 == 4) {
          type2 = *(byte *)&paVar19->array;
          if (type2 == 4) goto LAB_00116b3a;
          paVar19 = *(array_container_t **)paVar19;
        }
        local_68 = (array_container_t *)0x0;
        paVar9 = paVar13;
        switch((uint)type2 + (uint)bVar1 * 4) {
        case 5:
          _Var5 = bitset_bitset_container_intersection_inplace
                            ((bitset_container_t *)paVar13,(bitset_container_t *)paVar19,&local_68);
          goto LAB_00116986;
        case 6:
          paVar9 = (array_container_t *)malloc(0x10);
          if (paVar9 == (array_container_t *)0x0) {
            paVar9 = (array_container_t *)0x0;
          }
          else {
            paVar9->cardinality = 0;
            paVar9->capacity = 0;
            paVar9->array = (uint16_t *)0x0;
          }
          local_68 = paVar9;
          array_bitset_container_intersection(paVar19,(bitset_container_t *)paVar13,paVar9);
          local_69 = '\x02';
          break;
        case 7:
          _Var5 = run_bitset_container_intersection
                            ((run_container_t *)paVar19,(bitset_container_t *)paVar13,&local_50);
          local_69 = '\x02' - _Var5;
          paVar9 = local_50;
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1400,
                        "container_t *container_iand(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                       );
        case 9:
          local_69 = '\x02';
          array_bitset_container_intersection(paVar13,(bitset_container_t *)paVar19,paVar13);
          break;
        case 10:
          array_container_intersection_inplace(paVar13,paVar19);
          local_69 = '\x02';
          break;
        case 0xb:
          paVar9 = (array_container_t *)malloc(0x10);
          paVar10 = paVar19;
          paVar19 = paVar13;
          if (paVar9 == (array_container_t *)0x0) {
            paVar9 = (array_container_t *)0x0;
          }
          else {
            paVar9->cardinality = 0;
            paVar9->capacity = 0;
            paVar9->array = (uint16_t *)0x0;
          }
          goto LAB_00116ac9;
        case 0xd:
          _Var5 = run_bitset_container_intersection
                            ((run_container_t *)paVar13,(bitset_container_t *)paVar19,&local_68);
LAB_00116986:
          local_69 = '\x02' - _Var5;
          paVar9 = local_68;
          break;
        case 0xe:
          paVar9 = (array_container_t *)malloc(0x10);
          paVar10 = paVar13;
          if (paVar9 == (array_container_t *)0x0) {
            paVar9 = (array_container_t *)0x0;
          }
          else {
            paVar9->cardinality = 0;
            paVar9->capacity = 0;
            paVar9->array = (uint16_t *)0x0;
          }
LAB_00116ac9:
          local_69 = '\x02';
          local_68 = paVar9;
          array_run_container_intersection(paVar19,(run_container_t *)paVar10,paVar9);
          break;
        case 0xf:
          paVar10 = (array_container_t *)malloc(0x10);
          if (paVar10 == (array_container_t *)0x0) {
            paVar10 = (array_container_t *)0x0;
          }
          else {
            paVar10->cardinality = 0;
            paVar10->capacity = 0;
            paVar10->array = (uint16_t *)0x0;
          }
          local_68 = paVar10;
          run_container_intersection
                    ((run_container_t *)paVar13,(run_container_t *)paVar19,
                     (run_container_t *)paVar10);
          paVar9 = (array_container_t *)
                   convert_run_to_efficient_container((run_container_t *)paVar10,&local_69);
          if (paVar9 != paVar10) {
            run_container_free((run_container_t *)paVar10);
          }
        }
LAB_0011674c:
        if (paVar9 != paVar13) {
          container_free(paVar13,(uint8_t)local_40);
        }
        uVar20 = local_38;
        paVar13 = paVar9;
        uVar14 = local_69;
        if (local_69 == '\x04') {
          uVar14 = *(uint8_t *)&paVar9->array;
          if (uVar14 == '\x04') {
LAB_00116b3a:
            __assert_fail("*type != SHARED_CONTAINER_TYPE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1062,
                          "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                         );
          }
          paVar13 = *(array_container_t **)paVar9;
        }
        if ((uVar14 == '\x03') || (uVar14 == '\x02')) {
          bVar23 = 0 < paVar13->cardinality;
        }
        else {
          if (uVar14 != '\x01') {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x11c6,
                          "_Bool container_nonzero_cardinality(const container_t *, uint8_t)");
          }
          if (paVar13->cardinality == -1) {
            if (*(long *)paVar13->array == 0) {
              uVar8 = 0xffffffffffffffff;
              do {
                if (uVar8 == 0x3fe) {
                  uVar18 = 0x3ff;
                  break;
                }
                uVar18 = uVar8 + 1;
                lVar21 = uVar8 * 4;
                uVar8 = uVar18;
              } while (*(long *)(paVar13->array + lVar21 + 8) == 0);
              bVar23 = 0x3fe < uVar18;
            }
            else {
              bVar23 = false;
            }
          }
          else {
            bVar23 = paVar13->cardinality == 0;
          }
          bVar23 = (bool)(bVar23 ^ 1);
        }
        if (bVar23) {
          iVar7 = (int)local_38;
          if ((x1->high_low_container).size <= iVar7) {
            __assert_fail("i < ra->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                          ,0x1a55,
                          "void ra_replace_key_and_container_at_index(roaring_array_t *, int32_t, uint16_t, container_t *, uint8_t)"
                         );
          }
          (x1->high_low_container).keys[iVar7] = local_5e;
          (x1->high_low_container).containers[iVar7] = paVar9;
          (x1->high_low_container).typecodes[iVar7] = local_69;
          uVar20 = (ulong)(iVar7 + 1);
        }
        else {
          container_free(paVar9,local_69);
        }
        uVar8 = (ulong)((int)local_58 + 1);
        x2 = local_48;
        iVar7 = local_5c;
        uVar16 = uVar17 + 1;
LAB_00116a4c:
        uVar17 = uVar16;
      } while (((int)uVar8 < iVar3) && ((int)uVar17 < iVar7));
    }
    iVar7 = (int)uVar8;
    iVar22 = iVar3 - iVar7;
    if (iVar22 != 0 && iVar7 <= iVar3) {
      lVar21 = (long)iVar7;
      do {
        container_free((x1->high_low_container).containers[lVar21],
                       (x1->high_low_container).typecodes[lVar21]);
        lVar21 = lVar21 + 1;
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
    }
    if ((x1->high_low_container).size < (int)uVar20) {
      __assert_fail("new_length <= ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x47af,"void ra_downsize(roaring_array_t *, int32_t)");
    }
    (x1->high_low_container).size = (int)uVar20;
  }
  return;
}

Assistant:

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    if (x1 == x2) return;
    int pos1 = 0, pos2 = 0, intersection_size = 0;
    const int length1 = ra_get_size(&x1->high_low_container);
    const int length2 = ra_get_size(&x2->high_low_container);

    // any skipped-over or newly emptied containers in x1
    // have to be freed.
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2, result_type;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared container.
            // Rationale: using a shared container safely with in place computation would
            // require making a copy and then doing the computation in place which is likely
            // less efficient than avoiding in place entirely and always generating a new
            // container.
            container_t *c =
                (type1 == SHARED_CONTAINER_TYPE)
                    ? container_and(c1, type1, c2, type2, &result_type)
                    : container_iand(c1, type1, c2, type2, &result_type);

            if (c != c1) {  // in this instance a new container was created, and
                            // we need to free the old one
                container_free(c1, type1);
            }
            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c,
                                                      result_type);
                intersection_size++;
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {
            pos1 = ra_advance_until_freeing(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }

    // if we ended early because x2 ran out, then all remaining in x1 should be
    // freed
    while (pos1 < length1) {
        container_free(x1->high_low_container.containers[pos1],
                       x1->high_low_container.typecodes[pos1]);
        ++pos1;
    }

    // all containers after this have either been copied or freed
    ra_downsize(&x1->high_low_container, intersection_size);
}